

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Format::get_ids(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Format *this,
               CylHead *cylhead)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference rVar4;
  reference local_90;
  reference local_80;
  int local_6c;
  int local_68;
  int index;
  int s;
  int base_id;
  allocator<bool> local_49;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> used;
  CylHead *cylhead_local;
  Format *this_local;
  vector<int,_std::allocator<int>_> *ids;
  
  iVar2 = this->sectors;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)cylhead;
  std::allocator<bool>::allocator(&local_49);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_48,(long)iVar2,&local_49);
  std::allocator<bool>::~allocator(&local_49);
  s._3_1_ = 0;
  iVar2 = this->sectors;
  std::allocator<int>::allocator((allocator<int> *)((long)&s + 2));
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)iVar2,(allocator<int> *)((long)&s + 2));
  std::allocator<int>::~allocator((allocator<int> *)((long)&s + 2));
  index = this->base;
  for (local_68 = 0; local_68 < this->sectors; local_68 = local_68 + 1) {
    local_6c = (this->offset + local_68 * this->interleave +
               this->skew *
               (int)*used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage) % this->sectors;
    while( true ) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_48,(long)local_6c);
      local_80 = rVar4;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
      if (!bVar1) break;
      local_6c = (local_6c + 1) % this->sectors;
    }
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_48,(long)local_6c);
    local_90 = rVar4;
    std::_Bit_reference::operator=(&local_90,true);
    iVar2 = index + local_68;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_6c);
    *pvVar3 = iVar2;
  }
  s._3_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_48)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Format::get_ids(const CylHead& cylhead) const
{
    std::vector<bool> used(sectors);
    std::vector<int> ids(sectors);

    auto base_id = base;

    for (auto s = 0; s < sectors; ++s)
    {
        // Calculate the expected sector index using the interleave and skew
        auto index = (offset + s * interleave + skew * (cylhead.cyl)) % sectors;

        // Find a free slot starting from the expected position
        for (; used[index]; index = (index + 1) % sectors);
        used[index] = 1;

        // Assign the sector number, with offset adjustments
        ids[index] = base_id + s;
    }

    return ids;
}